

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

UBool __thiscall
icu_63::SimpleFormatter::applyPatternMinMaxArguments
          (SimpleFormatter *this,UnicodeString *pattern,int32_t min,int32_t max,
          UErrorCode *errorCode)

{
  UnicodeString *this_00;
  ushort uVar1;
  short sVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int32_t iVar11;
  uint uVar12;
  char16_t *pcVar13;
  char16_t cVar14;
  int iVar15;
  UChar local_68;
  UChar local_66 [2];
  char16_t local_62;
  char16_t *local_60;
  ulong local_58;
  int32_t local_50;
  int32_t local_4c;
  SimpleFormatter *local_48;
  UErrorCode *local_40;
  ulong local_38;
  
  if (U_ZERO_ERROR < *errorCode) {
    return '\0';
  }
  uVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      local_60 = (pattern->fUnion).fFields.fArray;
    }
    else {
      local_60 = (char16_t *)((long)&pattern->fUnion + 2);
    }
  }
  else {
    local_60 = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    uVar5 = (pattern->fUnion).fFields.fLength;
  }
  else {
    uVar5 = (int)(short)uVar1 >> 5;
  }
  this_00 = &this->compiledPattern;
  local_68 = L'\0';
  local_4c = max;
  icu_63::UnicodeString::unBogus(this_00);
  sVar2 = (this->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
  if (sVar2 < 0) {
    iVar11 = (this->compiledPattern).fUnion.fFields.fLength;
  }
  else {
    iVar11 = (int)sVar2 >> 5;
  }
  uVar12 = 0;
  local_50 = min;
  local_48 = this;
  local_40 = errorCode;
  icu_63::UnicodeString::doReplace(this_00,0,iVar11,&local_68,0,1);
  bVar3 = 0 < (int)uVar5;
  if ((int)uVar5 < 1) {
    local_58 = 0xffffffff;
  }
  else {
    local_38 = (ulong)uVar5;
    local_58 = 0xffffffff;
    iVar8 = 0;
    bVar4 = false;
    uVar12 = 0;
    pcVar13 = local_60;
    do {
      iVar15 = iVar8 + 1;
      cVar14 = pcVar13[iVar8];
      if (cVar14 == L'\'') {
        if ((iVar15 < (int)uVar5) && (cVar14 = pcVar13[iVar15], cVar14 == L'\'')) {
          iVar15 = iVar8 + 2;
        }
        else {
          if (bVar4) {
            uVar7 = 3;
            bVar4 = false;
            iVar8 = iVar15;
            goto LAB_0032ce7d;
          }
          if ((cVar14 == L'}') || (cVar14 == L'{')) {
            bVar4 = true;
            iVar15 = iVar8 + 2;
          }
          else {
            cVar14 = L'\'';
            bVar4 = false;
          }
        }
LAB_0032cd27:
        iVar8 = iVar15;
        if (uVar12 == 0) {
          local_66[1] = 0xffff;
          icu_63::UnicodeString::doAppend(this_00,local_66 + 1,0,1);
        }
        uVar7 = 0;
        local_62 = cVar14;
        icu_63::UnicodeString::doAppend(this_00,local_66 + 2,0,1);
        uVar12 = uVar12 + 1;
        pcVar13 = local_60;
        if (uVar12 == 0xfeff) {
          uVar12 = uVar7;
        }
      }
      else {
        if ((bVar4) || (cVar14 != L'{')) goto LAB_0032cd27;
        if (0 < (int)uVar12) {
          sVar2 = (local_48->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            iVar6 = (local_48->compiledPattern).fUnion.fFields.fLength;
          }
          else {
            iVar6 = (int)sVar2 >> 5;
          }
          icu_63::UnicodeString::setCharAt(this_00,~uVar12 + iVar6,(short)uVar12 + L'Ā');
          uVar12 = 0;
          pcVar13 = local_60;
        }
        iVar6 = iVar8 + 2;
        if (((iVar6 < (int)uVar5) && (uVar7 = (ushort)pcVar13[iVar15] - 0x30, (ushort)uVar7 < 10))
           && (pcVar13[iVar6] == L'}')) {
          iVar8 = iVar8 + 3;
        }
        else {
          uVar7 = 0xffffffff;
          if (iVar15 < (int)uVar5) {
            cVar14 = pcVar13[iVar15];
            iVar8 = iVar6;
            if (((ushort)(cVar14 + L'ￏ') < 9) &&
               (uVar7 = (ushort)cVar14 - 0x30, iVar6 < (int)uVar5)) {
              lVar10 = (long)iVar6;
              do {
                lVar9 = lVar10 + 1;
                iVar8 = (int)lVar9;
                cVar14 = pcVar13[lVar10];
                if ((9 < (ushort)(cVar14 + L'￐')) ||
                   (uVar7 = ((uint)(ushort)cVar14 + uVar7 * 10) - 0x30, 0xff < (int)uVar7)) break;
                lVar10 = lVar9;
              } while (lVar9 < (long)local_38);
            }
          }
          else {
            cVar14 = L'{';
            iVar8 = iVar15;
          }
          if ((cVar14 != L'}') || ((int)uVar7 < 0)) {
            *local_40 = U_ILLEGAL_ARGUMENT_ERROR;
            uVar7 = 1;
            bVar4 = false;
            goto LAB_0032ce7d;
          }
        }
        iVar15 = (int)local_58;
        local_58 = local_58 & 0xffffffff;
        if (iVar15 < (int)uVar7) {
          local_58 = (ulong)uVar7;
        }
        local_66[0] = (UChar)uVar7;
        bVar4 = false;
        icu_63::UnicodeString::doAppend(this_00,local_66,0,1);
        uVar7 = 3;
        pcVar13 = local_60;
      }
LAB_0032ce7d:
    } while (((uVar7 == 3) || (uVar7 == 0)) && (bVar3 = iVar8 < (int)uVar5, iVar8 < (int)uVar5));
  }
  iVar11 = local_50;
  if (!bVar3) {
    if (0 < (int)uVar12) {
      sVar2 = (local_48->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar8 = (local_48->compiledPattern).fUnion.fFields.fLength;
      }
      else {
        iVar8 = (int)sVar2 >> 5;
      }
      icu_63::UnicodeString::setCharAt(this_00,~uVar12 + iVar8,(short)uVar12 + L'Ā');
    }
    iVar8 = (int)local_58 + 1;
    if ((int)local_58 < local_4c && iVar11 <= iVar8) {
      icu_63::UnicodeString::setCharAt(this_00,0,(UChar)iVar8);
      return '\x01';
    }
    *local_40 = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return '\0';
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }